

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O1

void parseACOFile(filebuf *file)

{
  pointer paVar1;
  size_t i;
  long lVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char buf [10];
  byte local_3a [4];
  undefined1 local_36;
  
  lVar2 = (**(code **)(*(long *)file + 0x40))(file,local_3a,2);
  if (lVar2 == 2) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = (ushort)local_3a[lVar2] | uVar3 << 8;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    if (uVar3 == 1) {
      lVar2 = (**(code **)(*(long *)file + 0x40))(file,local_3a,2);
      if (lVar2 == 2) {
        lVar2 = 0;
        uVar5 = 0;
        do {
          uVar5 = (uVar5 & 0xff) << 8 | (uint)local_3a[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        if ((uint)options.nbPalettes * (uint)options.nbColorsPerPal < uVar5) {
          warning("ACO file contains %u colors, but there can only be %u; ignoring extra");
          uVar5 = (uint)options.nbPalettes * (uint)options.nbColorsPerPal;
        }
        if (options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        if ((short)uVar5 == 0) {
          return;
        }
        uVar4 = 0;
        do {
          lVar2 = (**(code **)(*(long *)file + 0x40))(file,local_3a,10);
          if (lVar2 != 10) {
            pcVar8 = "Failed to read color #%u from palette file";
            uVar7 = (ulong)((int)uVar4 + 1);
LAB_0010d2e4:
            error(pcVar8,uVar7);
            return;
          }
          if ((int)(uVar4 % (ulong)options.nbColorsPerPal) == 0) {
            if (options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
              _M_realloc_insert<>(&options.palSpec,
                                  (iterator)
                                  options.palSpec.
                                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
            }
            else {
              paVar1 = options.palSpec.
                       super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              paVar1->_M_elems[0].red = '\0';
              paVar1->_M_elems[0].green = '\0';
              paVar1->_M_elems[0].blue = '\0';
              paVar1->_M_elems[0].alpha = '\0';
              paVar1->_M_elems[1].red = '\0';
              paVar1->_M_elems[1].green = '\0';
              paVar1->_M_elems[1].blue = '\0';
              paVar1->_M_elems[1].alpha = '\0';
              paVar1->_M_elems[2].red = '\0';
              paVar1->_M_elems[2].green = '\0';
              paVar1->_M_elems[2].blue = '\0';
              paVar1->_M_elems[2].alpha = '\0';
              paVar1->_M_elems[3].red = '\0';
              paVar1->_M_elems[3].green = '\0';
              paVar1->_M_elems[3].blue = '\0';
              paVar1->_M_elems[3].alpha = '\0';
              options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar2 = 0;
          uVar7 = 0;
          do {
            uVar6 = ((uint)uVar7 & 0xff) << 8 | (uint)local_3a[lVar2];
            uVar7 = (ulong)uVar6;
            lVar2 = lVar2 + 1;
          } while (lVar2 == 1);
          if ((short)uVar6 != 0) {
            switch(uVar6) {
            case 1:
              pcVar8 = "Unsupported color type (HSB) for ACO file";
              break;
            case 2:
              pcVar8 = "Unsupported color type (CMYK) for ACO file";
              break;
            default:
              pcVar8 = "Unknown color type (%u) for ACO file";
              goto LAB_0010d2e4;
            case 7:
              pcVar8 = "Unsupported color type (lab) for ACO file";
              break;
            case 8:
              pcVar8 = "Unsupported color type (grayscale) for ACO file";
            }
            goto LAB_0010d27c;
          }
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish[-1]._M_elems[uVar4 % (ulong)options.nbColorsPerPal] =
               (Rgba)(CONCAT12(local_36,CONCAT11(local_3a[2],local_3a[0])) | 0xff000000);
          uVar6 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar6;
          if (uVar6 == uVar5) {
            return;
          }
        } while( true );
      }
      pcVar8 = "Couldn\'t read number of colors in palette file";
    }
    else {
      pcVar8 = "Palette file does not appear to be an ACO file";
    }
  }
  else {
    pcVar8 = "Couldn\'t read ACO file version";
  }
LAB_0010d27c:
  error(pcVar8);
  return;
}

Assistant:

static void parseACOFile(std::filebuf &file) {
	// https://www.adobe.com/devnet-apps/photoshop/fileformatashtml/#50577411_pgfId-1055819
	// http://www.nomodes.com/aco.html

	char buf[10];

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read ACO file version");
		return;
	}
	if (readBE<uint16_t>(buf) != 1) {
		error("Palette file does not appear to be an ACO file");
		return;
	}

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read number of colors in palette file");
		return;
	}
	uint16_t nbColors = readBE<uint16_t>(buf);

	if (nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("ACO file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();

	for (uint16_t i = 0; i < nbColors; ++i) {
		if (file.sgetn(buf, 10) != 10) {
			error("Failed to read color #%" PRIu16 " from palette file", i + 1);
			return;
		}

		if (i % options.nbColorsPerPal == 0) {
			options.palSpec.emplace_back();
		}

		Rgba &color = options.palSpec.back()[i % options.nbColorsPerPal];
		uint16_t colorType = readBE<uint16_t>(buf);
		switch (colorType) {
		case 0: // RGB
			color = Rgba(buf[0], buf[2], buf[4], 0xFF);
			break;
		case 1: // HSB
			error("Unsupported color type (HSB) for ACO file");
			return;
		case 2: // CMYK
			error("Unsupported color type (CMYK) for ACO file");
			return;
		case 7: // Lab
			error("Unsupported color type (lab) for ACO file");
			return;
		case 8: // Grayscale
			error("Unsupported color type (grayscale) for ACO file");
			return;
		default:
			error("Unknown color type (%" PRIu16 ") for ACO file", colorType);
			return;
		}
	}

	// TODO: maybe scan the v2 data instead (if present)
	// `codecvt` can be used to convert from UTF-16 to UTF-8
}